

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::handle_mouse_move(Plotter *this,int px,int py)

{
  double dVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  float *pfVar7;
  reference pvVar8;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar9;
  double dVar10;
  double fy;
  double fx;
  int dy;
  int dx;
  int sy;
  int sx;
  value_type *ptm;
  bool in_stack_00000186;
  bool in_stack_00000187;
  int in_stack_00000188;
  int in_stack_0000018c;
  Plotter *in_stack_00000190;
  float local_38;
  float local_34;
  float local_30;
  int local_2c;
  float local_28;
  float local_24;
  float local_20;
  int local_1c;
  reference local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  if (((*(int *)(in_RDI + 0x32c) == -1) ||
      (iVar3 = *(int *)(in_RDI + 0x32c),
      sVar4 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::size
                        ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                         (in_RDI + 0x280)), sVar4 <= (ulong)(long)iVar3)) ||
     ((pvVar5 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
                          ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                           (in_RDI + 0x280),(long)*(int *)(in_RDI + 0x32c)),
      pvVar5->drag_var_x == 0xffffffffffffffff &&
      (pvVar5 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
                          ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                           (in_RDI + 0x280),(long)*(int *)(in_RDI + 0x32c)),
      pvVar5->drag_var_y == 0xffffffffffffffff)))) {
    if ((*(byte *)(in_RDI + 800) & 1) == 0) {
      if ((((local_c < 0) || (local_10 < 0)) ||
          (iVar3 = local_10 * *(int *)(in_RDI + 8) + local_c,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (in_RDI + 0x298)), sVar4 <= (ulong)(long)iVar3)) ||
         (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x298),(long)(local_10 * *(int *)(in_RDI + 8) + local_c)),
         *pvVar8 == 0xffffffffffffffff)) {
        std::__cxx11::string::clear();
      }
      else {
        detect_marker_click(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000187,
                            in_stack_00000186);
      }
    }
    else {
      iVar3 = *(int *)(in_RDI + 0x324);
      iVar2 = *(int *)(in_RDI + 0x328);
      *(int *)(in_RDI + 0x324) = local_c;
      *(int *)(in_RDI + 0x328) = local_10;
      dVar9 = ((*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18)) /
              (double)*(int *)(in_RDI + 8)) * (double)(local_c - iVar3);
      dVar10 = ((*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28)) /
               (double)*(int *)(in_RDI + 0xc)) * (double)(local_10 - iVar2);
      *(double *)(in_RDI + 0x10) = *(double *)(in_RDI + 0x10) - dVar9;
      *(double *)(in_RDI + 0x18) = *(double *)(in_RDI + 0x18) - dVar9;
      *(double *)(in_RDI + 0x20) = dVar10 + *(double *)(in_RDI + 0x20);
      *(double *)(in_RDI + 0x28) = dVar10 + *(double *)(in_RDI + 0x28);
      *(undefined1 *)(in_RDI + 0xe1) = 1;
    }
  }
  else {
    local_18 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
                         ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                          (in_RDI + 0x280),(long)*(int *)(in_RDI + 0x32c));
    if (local_18->drag_var_x != 0xffffffffffffffff) {
      dVar9 = *(double *)(in_RDI + 0x10);
      dVar10 = *(double *)(in_RDI + 0x18);
      iVar3 = *(int *)(in_RDI + 8);
      dVar1 = *(double *)(in_RDI + 0x18);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                          local_18->drag_var_x);
      *pvVar6 = ((double)local_c * 1.0 * (dVar9 - dVar10)) / (double)iVar3 + dVar1;
    }
    if (local_18->drag_var_y != 0xffffffffffffffff) {
      iVar3 = *(int *)(in_RDI + 0xc);
      dVar9 = *(double *)(in_RDI + 0x20);
      dVar10 = *(double *)(in_RDI + 0x28);
      iVar2 = *(int *)(in_RDI + 0xc);
      dVar1 = *(double *)(in_RDI + 0x28);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                          local_18->drag_var_y);
      *pvVar6 = ((double)(iVar3 - local_10) * 1.0 * (dVar9 - dVar10)) / (double)iVar2 + dVar1;
    }
    local_20 = (float)(((local_18->x - *(double *)(in_RDI + 0x18)) * (double)*(int *)(in_RDI + 8)) /
                      (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18)));
    local_24 = 0.0;
    pfVar7 = std::max<float>(&local_20,&local_24);
    local_28 = (float)*(int *)(in_RDI + 8) - 1.0;
    pfVar7 = std::min<float>(pfVar7,&local_28);
    local_1c = (int)(*pfVar7 + 0.5);
    local_30 = (float)(((*(double *)(in_RDI + 0x20) - local_18->y) * (double)*(int *)(in_RDI + 0xc))
                      / (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28)));
    local_34 = 0.0;
    pfVar7 = std::max<float>(&local_30,&local_34);
    local_38 = (float)*(int *)(in_RDI + 0xc) - 1.0;
    pfVar7 = std::min<float>(pfVar7,&local_38);
    local_2c = (int)(*pfVar7 + 0.5);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x298),
                        (long)(local_2c * *(int *)(in_RDI + 8) + local_1c));
    if (*pvVar8 != 0xffffffffffffffff) {
      detect_marker_click(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000187,
                          in_stack_00000186);
    }
    *(undefined1 *)(in_RDI + 0xe1) = 1;
  }
  return;
}

Assistant:

void Plotter::handle_mouse_move(int px, int py) {
    if (~drag_marker &&
        drag_marker < pt_markers.size() &&
            (~pt_markers[drag_marker].drag_var_x ||
             ~pt_markers[drag_marker].drag_var_y)) {
        // Draggable marker
        auto& ptm = pt_markers[drag_marker];
        if (~ptm.drag_var_x) {
            env.vars[ptm.drag_var_x] = _SX_TO_X(px);
        }
        if (~ptm.drag_var_y) {
            env.vars[ptm.drag_var_y] = _SY_TO_Y(py);
        }
        int sx = (int)(std::min(std::max(_X_TO_SX(ptm.x), 0.f), (float) view.swid - 1.f) + 0.5f);
        int sy = (int)(std::min(std::max(_Y_TO_SY(ptm.y), 0.f), (float) view.shigh - 1.f) + 0.5f);
        if (~grid[sy * view.swid + sx]) detect_marker_click(sx, sy, true, false);
        require_update = true;
        return;
    }
    if (drag_view) {
        // Dragging background
        int dx = px - dragx;
        int dy = py - dragy;
        dragx = px; dragy = py;
        double fx = (view.xmax - view.xmin) / view.swid * dx;
        double fy = (view.ymax - view.ymin) / view.shigh * dy;
        view.xmax -= fx; view.xmin -= fx;
        view.ymax += fy; view.ymin += fy;
        require_update = true;
    } else if (px >= 0 && py >= 0 &&
            py * view.swid + px < grid.size() &&
            ~grid[py * view.swid + px]) {
        // Trace drag mode
        // Show marker if point marker under cursor
        detect_marker_click(px, py, !drag_trace, false);
    } else {
        marker_text.clear();
    }
}